

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_ledger.cpp
# Opt level: O2

ByteData * __thiscall
cfd::api::LedgerApi::Serialize
          (ByteData *__return_storage_ptr__,LedgerApi *this,ConfidentialTransactionContext *tx,
          vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
          *metadata_stack,bool skip_witness,bool is_authorization)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  const_reference hex;
  CfdException *this_00;
  ulong __n;
  byte bVar4;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  uint32_t index;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3d0;
  ByteData token;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data_1;
  int32_t version;
  ByteData asset;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_328;
  string local_310;
  vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
  *local_2f0;
  string local_2e8;
  uint32_t sequence;
  ConfidentialNonce local_2b0;
  LedgerMetaDataStackItem empty_item;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_228;
  ulong local_210;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_208;
  ByteData issuance;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  ByteData temp_data;
  ConfidentialTxOutReference txout;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_2f0 = metadata_stack;
  iVar2 = (*(tx->super_ConfidentialTransaction).super_AbstractTransaction._vptr_AbstractTransaction
            [7])(tx);
  core::ByteData::ByteData(__return_storage_ptr__);
  core::ByteData::ByteData(&temp_data);
  core::ByteData::ByteData(&issuance);
  version = core::AbstractTransaction::GetVersion((AbstractTransaction *)tx);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data,4,
             (allocator_type *)&txout);
  memcpy(byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,&version,
         (long)byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  core::ByteData::ByteData((ByteData *)&txout,&byte_data);
  core::ByteData::Push(__return_storage_ptr__,(ByteData *)&txout);
  bVar4 = (byte)iVar2 & (!skip_witness && !is_authorization);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txout);
  if (bVar4 != 0) {
    std::__cxx11::string::string((string *)&txout,"0001",(allocator *)&asset);
    core::ByteData::ByteData((ByteData *)&empty_item,(string *)&txout);
    core::ByteData::Push(__return_storage_ptr__,(ByteData *)&empty_item);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&empty_item);
    std::__cxx11::string::~string((string *)&txout);
  }
  uVar3 = core::ConfidentialTransaction::GetTxInCount(&tx->super_ConfidentialTransaction);
  core::ByteData::GetVariableInt((ByteData *)&txout,(ulong)uVar3);
  core::ByteData::Push(__return_storage_ptr__,(ByteData *)&txout);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txout);
  for (index = 0; uVar3 != index; index = index + 1) {
    core::ConfidentialTransaction::GetTxIn
              ((ConfidentialTxInReference *)&txout,&tx->super_ConfidentialTransaction,index);
    core::ByteData::ByteData((ByteData *)&local_3d0);
    local_328._M_impl.super__Vector_impl_data._M_start._0_4_ =
         (uint)txout.super_AbstractTxOutReference.locking_script_.script_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish & 0x3fffffff;
    if (!is_authorization) {
      local_328._M_impl.super__Vector_impl_data._M_start._0_4_ =
           (uint)txout.super_AbstractTxOutReference.locking_script_.script_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data_1,4,
               (allocator_type *)&empty_item);
    memcpy(byte_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,&local_328,
           (long)byte_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)byte_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    core::Txid::Txid((Txid *)&empty_item,(Txid *)&txout.super_AbstractTxOutReference.value_);
    core::Txid::GetData(&asset,(Txid *)&empty_item);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3d0,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&asset);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&asset);
    core::Txid::~Txid((Txid *)&empty_item);
    core::ByteData::ByteData((ByteData *)&empty_item,&byte_data_1);
    core::ByteData::Push((ByteData *)&local_3d0,(ByteData *)&empty_item);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&empty_item);
    if (!is_authorization) {
      core::Script::Script
                ((Script *)&empty_item,
                 (Script *)
                 &txout.super_AbstractTxOutReference.locking_script_.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      core::Script::GetData(&token,(Script *)&empty_item);
      core::ByteData::Serialize(&asset,&token);
      core::ByteData::Push((ByteData *)&local_3d0,&asset);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&asset);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&token);
      core::Script::~Script((Script *)&empty_item);
    }
    sequence = (uint32_t)
               txout.asset_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    memcpy(byte_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,&sequence,
           (long)byte_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)byte_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    core::ByteData::ByteData((ByteData *)&empty_item,&byte_data_1);
    core::ByteData::Push((ByteData *)&local_3d0,(ByteData *)&empty_item);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&empty_item);
    if (is_authorization) {
      core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&empty_item,(ConfidentialValue *)&txout.nonce_.version_);
      bVar1 = core::ConfidentialValue::IsEmpty((ConfidentialValue *)&empty_item);
      if (bVar1) {
        core::ConfidentialValue::ConfidentialValue
                  ((ConfidentialValue *)&asset,
                   (ConfidentialValue *)
                   &txout.range_proof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        bVar1 = core::ConfidentialValue::IsEmpty((ConfidentialValue *)&asset);
        core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&asset);
        core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&empty_item);
        if (bVar1) {
          std::__cxx11::string::string((string *)&empty_item,"00",(allocator *)&token);
          core::ByteData::ByteData(&asset,&empty_item.metadata1);
          core::ByteData::Push(&issuance,&asset);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&asset);
          std::__cxx11::string::~string((string *)&empty_item);
          goto LAB_0033c9af;
        }
      }
      else {
        core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&empty_item);
      }
      core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&empty_item,(ConfidentialValue *)&txout.nonce_.version_);
      core::ConfidentialValue::GetData(&asset,(ConfidentialValue *)&empty_item);
      core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&empty_item);
      bVar1 = core::ByteData::IsEmpty(&asset);
      if (bVar1) {
        std::__cxx11::string::string((string *)&empty_item,"00",(allocator *)&local_2b0);
        core::ByteData::ByteData(&token,&empty_item.metadata1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&asset,
                   (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&token);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&token);
        std::__cxx11::string::~string((string *)&empty_item);
      }
      core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&empty_item,
                 (ConfidentialValue *)
                 &txout.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      core::ConfidentialValue::GetData(&token,(ConfidentialValue *)&empty_item);
      core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&empty_item);
      bVar1 = core::ByteData::IsEmpty(&token);
      if (bVar1) {
        std::__cxx11::string::string((string *)&empty_item,"00",(allocator *)&local_310);
        core::ByteData::ByteData((ByteData *)&local_2b0,&empty_item.metadata1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&token,&local_2b0);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2b0);
        std::__cxx11::string::~string((string *)&empty_item);
      }
      core::ByteData::ByteData((ByteData *)&empty_item);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_310,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &txout.confidential_value_.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2e8,
                 &txout.nonce_.data_.data_);
      core::ByteData::
      Concat<cfd::core::ByteData256,cfd::core::ByteData256,cfd::core::ByteData,cfd::core::ByteData>
                ((ByteData *)&local_2b0,(ByteData *)&empty_item,(ByteData256 *)&local_310,
                 (ByteData256 *)&local_2e8,&asset,&token);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&empty_item,&local_2b0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2b0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2e8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_310);
      core::ByteData::Push(&issuance,(ByteData *)&empty_item);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&empty_item);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&token);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&asset);
    }
LAB_0033c9af:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&byte_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_data,&local_3d0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3d0);
    core::ConfidentialTxInReference::~ConfidentialTxInReference((ConfidentialTxInReference *)&txout)
    ;
    core::ByteData::Push(__return_storage_ptr__,&temp_data);
  }
  empty_item.metadata1._M_dataplus._M_p = (pointer)&empty_item.metadata1.field_2;
  empty_item.metadata1._M_string_length = 0;
  empty_item.metadata1.field_2._M_local_buf[0] = '\0';
  empty_item.metadata2._M_dataplus._M_p = (pointer)&empty_item.metadata2.field_2;
  empty_item.metadata2._M_string_length = 0;
  empty_item.metadata2.field_2._M_local_buf[0] = '\0';
  empty_item.metadata3._M_dataplus._M_p = (pointer)&empty_item.metadata3.field_2;
  empty_item.metadata3._M_string_length = 0;
  empty_item.metadata3.field_2._M_local_buf[0] = '\0';
  uVar3 = core::ConfidentialTransaction::GetTxOutCount(&tx->super_ConfidentialTransaction);
  local_210 = (ulong)uVar3;
  core::ByteData::GetVariableInt((ByteData *)&txout,local_210);
  core::ByteData::Push(__return_storage_ptr__,(ByteData *)&txout);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txout);
  __n = 0;
  do {
    if (local_210 == __n) {
      if (bVar4 == 0) {
        if (is_authorization) {
          core::HashUtil::Sha256((ByteData256 *)&txout,__return_storage_ptr__);
          core::HashUtil::Sha256((ByteData256 *)&asset,&issuance);
          core::ByteData256::Concat<cfd::core::ByteData256>
                    ((ByteData *)&byte_data_1,(ByteData256 *)&txout,(ByteData256 *)&asset);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__
                     ,&byte_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    );
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&byte_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
          ;
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&asset);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txout);
        }
        LedgerMetaDataStackItem::~LedgerMetaDataStackItem(&empty_item);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&issuance);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_data);
        return __return_storage_ptr__;
      }
      asset.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ =
           core::AbstractTransaction::GetLockTime((AbstractTransaction *)tx);
      memcpy(byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,&asset,
             (long)byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      core::ByteData::ByteData((ByteData *)&txout,&byte_data);
      core::ByteData::Push(__return_storage_ptr__,(ByteData *)&txout);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txout);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&txout,"Witness serialization is not implemented.",
                 (allocator *)&byte_data_1);
      core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&txout);
      __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::ConfidentialTransaction::GetTxOut(&txout,&tx->super_ConfidentialTransaction,(uint32_t)__n)
    ;
    hex = &empty_item;
    if (__n < (ulong)(((long)(local_2f0->
                             super__Vector_base<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_2f0->
                            super__Vector_base<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x60)) {
      hex = std::
            vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
            ::at(local_2f0,__n);
    }
    core::ByteData::ByteData((ByteData *)&local_208);
    if (is_authorization) {
      core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&asset,&txout.confidential_value_);
      bVar1 = core::ConfidentialValue::HasBlinding((ConfidentialValue *)&asset);
      core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&asset);
      if (!bVar1) {
        core::ConfidentialAssetId::ConfidentialAssetId
                  ((ConfidentialAssetId *)&byte_data_1,&txout.asset_);
        core::ConfidentialAssetId::GetHex_abi_cxx11_
                  ((string *)&local_2b0,(ConfidentialAssetId *)&byte_data_1);
        core::ByteData::ByteData((ByteData *)&local_328,(string *)&local_2b0);
        core::ConfidentialValue::ConfidentialValue
                  ((ConfidentialValue *)&token,&txout.confidential_value_);
        core::ConfidentialValue::GetHex_abi_cxx11_(&local_2e8,(ConfidentialValue *)&token);
        std::__cxx11::string::substr((ulong)&local_310,(ulong)&local_2e8);
        core::ByteData::ByteData((ByteData *)&sequence,&local_310);
        core::Script::Script((Script *)&asset,&txout.super_AbstractTxOutReference.locking_script_);
        core::Script::GetData((ByteData *)&local_48,(Script *)&asset);
        core::ByteData::Serialize((ByteData *)&local_228,(ByteData *)&local_48);
        this_01 = &local_328;
        core::ByteData::Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
                  ((ByteData *)&local_3d0,(ByteData *)&local_208,(ByteData *)this_01,
                   (ByteData *)&sequence,(ByteData *)&local_228);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,&local_3d0);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3d0);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_228);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
        core::Script::~Script((Script *)&asset);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sequence);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_2e8);
        core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&token);
LAB_0033cfec:
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this_01);
        std::__cxx11::string::~string((string *)&local_2b0);
        goto LAB_0033cffe;
      }
      if ((hex->metadata1)._M_string_length == 0) {
        core::ConfidentialAssetId::ConfidentialAssetId
                  ((ConfidentialAssetId *)&byte_data_1,&txout.asset_);
        core::ConfidentialAssetId::GetHex_abi_cxx11_
                  ((string *)&local_2b0,(ConfidentialAssetId *)&byte_data_1);
        core::ByteData::ByteData((ByteData *)&local_3d0,(string *)&local_2b0);
        core::ConfidentialValue::ConfidentialValue
                  ((ConfidentialValue *)&token,&txout.confidential_value_);
        core::ConfidentialValue::GetHex_abi_cxx11_(&local_310,(ConfidentialValue *)&token);
        core::ByteData::ByteData((ByteData *)&local_328,&local_310);
        core::Script::Script((Script *)&asset,&txout.super_AbstractTxOutReference.locking_script_);
        core::Script::GetData((ByteData *)&local_228,(Script *)&asset);
        core::ByteData::Serialize((ByteData *)&sequence,(ByteData *)&local_228);
        this_01 = &local_3d0;
        core::ByteData::Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
                  ((ByteData *)&local_2e8,(ByteData *)&local_208,(ByteData *)this_01,
                   (ByteData *)&local_328,(ByteData *)&sequence);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,&local_2e8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2e8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sequence);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_228);
        core::Script::~Script((Script *)&asset);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_328);
        std::__cxx11::string::~string((string *)&local_310);
        core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&token);
        goto LAB_0033cfec;
      }
      core::ByteData::ByteData(&token,&hex->metadata1);
      core::ByteData::ByteData((ByteData *)&local_2b0,&hex->metadata2);
      core::Script::Script((Script *)&asset,&txout.super_AbstractTxOutReference.locking_script_);
      core::Script::GetData((ByteData *)&local_2e8,(Script *)&asset);
      core::ByteData::Serialize((ByteData *)&local_310,(ByteData *)&local_2e8);
      core::ByteData::Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
                ((ByteData *)
                 &byte_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                 (ByteData *)&local_208,&token,(ByteData *)&local_2b0,(ByteData *)&local_310);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,
                 &byte_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&byte_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_310);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2e8);
      core::Script::~Script((Script *)&asset);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2b0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&token);
    }
    else {
      core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)&byte_data_1,&txout.asset_);
      core::ConfidentialAssetId::GetData((ByteData *)&local_2e8,(ConfidentialAssetId *)&byte_data_1)
      ;
      core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&token,&txout.confidential_value_);
      core::ConfidentialValue::GetData((ByteData *)&local_3d0,(ConfidentialValue *)&token);
      core::ConfidentialNonce::ConfidentialNonce(&local_2b0,&txout.nonce_);
      core::ConfidentialNonce::GetData((ByteData *)&local_328,&local_2b0);
      core::Script::Script((Script *)&asset,&txout.super_AbstractTxOutReference.locking_script_);
      core::Script::GetData((ByteData *)&local_228,(Script *)&asset);
      core::ByteData::Serialize((ByteData *)&sequence,(ByteData *)&local_228);
      core::ByteData::
      Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
                ((ByteData *)&local_310,(ByteData *)&local_208,(ByteData *)&local_2e8,
                 (ByteData *)&local_3d0,(ByteData *)&local_328,(ByteData *)&sequence);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,&local_310);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_310);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sequence);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_228);
      core::Script::~Script((Script *)&asset);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_328);
      core::ConfidentialNonce::~ConfidentialNonce(&local_2b0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3d0);
      core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&token);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2e8);
LAB_0033cffe:
      core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&byte_data_1);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_data,&local_208);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
    core::ByteData::Push(__return_storage_ptr__,&temp_data);
    core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&txout);
    __n = __n + 1;
  } while( true );
}

Assistant:

ByteData LedgerApi::Serialize(
    const ConfidentialTransactionContext& tx,
    const std::vector<LedgerMetaDataStackItem>& metadata_stack,
    bool skip_witness, bool is_authorization) const {
  static auto serialize_input_function =
      [](const ConfidentialTxInReference& txin, bool is_authorization,
         ByteData* issuance) -> ByteData {
    ByteData txin_bytes;
    uint32_t vout = txin.GetVout();
    if (is_authorization) {
      vout &= 0x3fffffff;  // ignore flag
    }
    std::vector<uint8_t> byte_data(sizeof(vout));
    memcpy(byte_data.data(), &vout, byte_data.size());
    txin_bytes = txin.GetTxid().GetData();
    txin_bytes.Push(ByteData(byte_data));
    if (!is_authorization) {
      txin_bytes.Push(txin.GetUnlockingScript().GetData().Serialize());
    }
    uint32_t sequence = txin.GetSequence();
    memcpy(byte_data.data(), &sequence, byte_data.size());
    txin_bytes.Push(ByteData(byte_data));

    if (!issuance || !is_authorization) {
      // do nothing
    } else if (
        txin.GetIssuanceAmount().IsEmpty() &&
        txin.GetInflationKeys().IsEmpty()) {
      issuance->Push(ByteData("00"));
    } else {
      ByteData asset = txin.GetIssuanceAmount().GetData();
      if (asset.IsEmpty()) asset = ByteData("00");
      ByteData token = txin.GetInflationKeys().GetData();
      if (token.IsEmpty()) token = ByteData("00");
      ByteData issuance_bytes;
      issuance_bytes = issuance_bytes.Concat(
          txin.GetBlindingNonce(), txin.GetAssetEntropy(), asset, token);
      issuance->Push(issuance_bytes);
    }
    return txin_bytes;
  };

  static auto serialize_output_function =
      [](const ConfidentialTxOutReference& txout, bool is_authorization,
         const LedgerMetaDataStackItem& metadata) -> ByteData {
    ByteData txout_bytes;
    if (!is_authorization) {
      txout_bytes = txout_bytes.Concat(
          txout.GetAsset().GetData(), txout.GetConfidentialValue().GetData(),
          txout.GetNonce().GetData(),
          txout.GetLockingScript().GetData().Serialize());
    } else if (!txout.GetConfidentialValue().HasBlinding()) {
      txout_bytes = txout_bytes.Concat(
          ByteData(txout.GetAsset().GetHex()),
          ByteData(txout.GetConfidentialValue().GetHex().substr(2)),
          txout.GetLockingScript().GetData().Serialize());
    } else if (!metadata.metadata1.empty()) {
      txout_bytes = txout_bytes.Concat(
          ByteData(metadata.metadata1), ByteData(metadata.metadata2),
          txout.GetLockingScript().GetData().Serialize());
    } else {
      txout_bytes = txout_bytes.Concat(
          ByteData(txout.GetAsset().GetHex()),
          ByteData(txout.GetConfidentialValue().GetHex()),
          txout.GetLockingScript().GetData().Serialize());
    }
    return txout_bytes;
  };

  bool has_witness = (tx.HasWitness() && !skip_witness && !is_authorization);
  ByteData data;
  ByteData temp_data;
  ByteData issuance;

  // version
  int32_t version = tx.GetVersion();
  std::vector<uint8_t> byte_data(sizeof(version));
  memcpy(byte_data.data(), &version, byte_data.size());
  data.Push(ByteData(byte_data));

  // marker & flag (equivalent to bitcoin format)
  if (has_witness) {
    data.Push(ByteData("0001"));
  }

  uint32_t txin_count = tx.GetTxInCount();
  data.Push(ByteData::GetVariableInt(txin_count));
  for (uint32_t index = 0; index < txin_count; ++index) {
    temp_data = serialize_input_function(
        tx.GetTxIn(index), is_authorization, &issuance);
    data.Push(temp_data);
  }

  LedgerMetaDataStackItem empty_item;
  uint32_t txout_count = tx.GetTxOutCount();
  data.Push(ByteData::GetVariableInt(txout_count));
  for (uint32_t index = 0; index < txout_count; ++index) {
    auto txout = tx.GetTxOut(index);
    temp_data = serialize_output_function(
        txout, is_authorization,
        (metadata_stack.size() > index) ? metadata_stack.at(index)
                                        : empty_item);
    data.Push(temp_data);
  }

  if (has_witness) {
    // locktime
    uint32_t locktime = tx.GetLockTime();
    memcpy(byte_data.data(), &locktime, byte_data.size());
    data.Push(ByteData(byte_data));

    // issue rangeproof, token rangeproof, witness, pegin witness
    // surjectionproof, rangeproof
    // FIXME(k-matsuzawa): not implement
    throw CfdException(
        CfdError::kCfdIllegalStateError,
        "Witness serialization is not implemented.");
  }

  if (is_authorization) {
    ByteData256 tx_hash = HashUtil::Sha256(data);
    ByteData256 issuance_hash = HashUtil::Sha256(issuance);
    data = tx_hash.Concat(issuance_hash);
  }

  return data;
}